

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::QLineEdit(QLineEdit *this,QString *contents,QWidget *parent)

{
  QWidgetPrivate *this_00;
  
  this_00 = (QWidgetPrivate *)operator_new(0x2f8);
  QWidgetPrivate::QWidgetPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QLineEditPrivate_007f45f8;
  *(undefined8 *)(this_00 + 1) = 0;
  *(undefined8 *)&this_00[1].field_0x8 = 0;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(undefined8 *)&this_00[1].field_0x18 = 0;
  *(undefined4 *)&this_00[1].field_0x20 = 0;
  this_00[1].field_0x24 = this_00[1].field_0x24 & 0xc0 | 3;
  *(undefined8 *)&this_00[1].field_0x28 = 0;
  *(undefined4 *)&this_00[1].field_0x30 = 0x81;
  *(undefined8 *)&this_00[1].field_0x34 = 0;
  *(undefined8 *)&this_00[1].field_0x3c = 0;
  *(undefined8 *)&this_00[1].field_0x44 = 0;
  *(undefined8 *)&this_00[1].field_0x4c = 0;
  *(undefined8 *)&this_00[1].field_0x54 = 0;
  *(undefined8 *)&this_00[1].field_0x5c = 0;
  *(undefined8 *)&this_00[1].field_0x64 = 0;
  *(undefined8 *)&this_00[1].field_0x6c = 0;
  *(undefined8 *)&this_00[1].field_0x74 = 0;
  *(undefined8 *)
   ((long)&this_00[1].extra._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl + 4) = 0;
  *(undefined8 *)((long)&this_00[1].focus_next + 4) = 0;
  *(undefined8 *)((long)&this_00[1].focus_prev + 4) = 0;
  this_00[1].focus_child = (QWidget *)0x0;
  this_00[1].layout = (QLayout *)0x0;
  QWidget::QWidget(&this->super_QWidget,this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f4238;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QLineEdit_007f43f0;
  QLineEditPrivate::init
            (*(QLineEditPrivate **)&(this->super_QWidget).field_0x8,(EVP_PKEY_CTX *)contents);
  return;
}

Assistant:

QLineEdit::QLineEdit(const QString& contents, QWidget* parent)
    : QWidget(*new QLineEditPrivate, parent, { })
{
    Q_D(QLineEdit);
    d->init(contents);
}